

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

void bgrat(double *a,double *b,double *x,double *y,double *w,double *eps,int *ierr)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  bgrat::bm1 = *b + -0.5 + -0.5;
  bgrat::nu = bgrat::bm1 * 0.5 + *a;
  if (*y <= 0.375) {
    bgrat::T1 = -*y;
    bgrat::lnx = alnrel(&bgrat::T1);
  }
  else {
    bgrat::lnx = log(*x);
  }
  bgrat::z = -bgrat::nu * bgrat::lnx;
  dVar8 = *b;
  dVar9 = bgrat::z * dVar8;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar6 = gam1(b);
    dVar9 = *b;
    dVar7 = log(bgrat::z);
    dVar9 = exp(dVar7 * dVar9);
    bgrat::r = dVar9 * dVar8 * (dVar6 + 1.0);
    dVar8 = exp(*a * bgrat::lnx);
    dVar9 = exp(bgrat::bm1 * 0.5 * bgrat::lnx);
    bgrat::r = dVar9 * dVar8 * bgrat::r;
    dVar6 = algdiv(b,a);
    dVar8 = *b;
    dVar7 = log(bgrat::nu);
    dVar9 = bgrat::r;
    dVar8 = exp(-(dVar7 * dVar8 + dVar6));
    bgrat::u = dVar8 * dVar9;
    if ((bgrat::u != 0.0) || (NAN(bgrat::u))) {
      grat1(b,&bgrat::z,&bgrat::r,&bgrat::p,&bgrat::q,eps);
      dVar7 = bgrat::z;
      dVar6 = bgrat::u;
      dVar9 = bgrat::bm1;
      dVar10 = 1.0 / bgrat::nu;
      dVar13 = bgrat::lnx * 0.25 * bgrat::lnx;
      dVar8 = *w;
      dVar15 = dVar8 / bgrat::u;
      dVar14 = bgrat::q / bgrat::r;
      lVar1 = 1;
      lVar2 = 0;
      dVar18 = 1.0;
      dVar19 = 1.0;
      dVar20 = dVar14;
      dVar21 = 0.0;
      do {
        if (lVar1 == 0x1f) break;
        dVar16 = *b;
        dVar11 = dVar21 + 2.0;
        dVar18 = dVar18 / ((dVar11 + 1.0) * dVar11);
        *(double *)(lVar1 * 8 + 0x116898) = dVar18;
        dVar17 = 0.0;
        if (lVar1 != 1) {
          pdVar3 = bgrat::c;
          lVar4 = lVar2;
          dVar12 = dVar16 - (double)(int)lVar1;
          while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
            dVar17 = dVar17 + dVar12 * *pdVar3 * bgrat::d[lVar4];
            pdVar3 = pdVar3 + 1;
            dVar12 = dVar16 + dVar12;
          }
        }
        dVar16 = dVar16 + dVar21;
        dVar20 = (dVar20 * (dVar16 + 1.0) * dVar16 + (dVar16 + dVar7 + 1.0) * dVar19) *
                 dVar10 * dVar10 * 0.25;
        dVar16 = dVar9 * dVar18 + dVar17 / (double)(int)lVar1;
        bgrat::c[lVar1 + 0x1d] = dVar16;
        dVar16 = dVar16 * dVar20;
        dVar14 = dVar14 + dVar16;
        if (dVar14 <= 0.0) goto LAB_00104dd4;
        dVar19 = dVar19 * dVar13;
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 1;
        dVar21 = dVar11;
      } while ((dVar15 + dVar14) * *eps < ABS(dVar16));
      *ierr = 0;
      *w = dVar6 * dVar14 + dVar8;
      return;
    }
  }
LAB_00104dd4:
  *ierr = 1;
  return;
}

Assistant:

void bgrat(double *a,double *b,double *x,double *y,double *w,
           double *eps,int *ierr)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) WHEN A IS LARGER THAN B.
     THE RESULT OF THE EXPANSION IS ADDED TO W. IT IS ASSUMED
     THAT A .GE. 15 AND B .LE. 1.  EPS IS THE TOLERANCE USED.
     IERR IS A VARIABLE THAT REPORTS THE STATUS OF THE RESULTS.
-----------------------------------------------------------------------
*/
{
static double bm1,bp2n,cn,coef,dj,j,l,lnx,n2,nu,p,q,r,s,sum,t,t2,u,v,z;
static int i,n,nm1;
static double c[30],d[30],T1;
/*
     ..
     .. Executable Statements ..
*/
    bm1 = *b-0.5e0-0.5e0;
    nu = *a+0.5e0*bm1;
    if(*y > 0.375e0) goto S10;
    T1 = -*y;
    lnx = alnrel(&T1);
    goto S20;
S10:
    lnx = log(*x);
S20:
    z = -(nu*lnx);
    if(*b*z == 0.0e0) goto S70;
/*
                 COMPUTATION OF THE EXPANSION
                 SET R = EXP(-Z)*Z**B/GAMMA(B)
*/
    r = *b*(1.0e0+gam1(b))*exp(*b*log(z));
    r *= (exp(*a*lnx)*exp(0.5e0*bm1*lnx));
    u = algdiv(b,a)+*b*log(nu);
    u = r*exp(-u);
    if(u == 0.0e0) goto S70;
    grat1(b,&z,&r,&p,&q,eps);
    v = 0.25e0*pow(1.0e0/nu,2.0);
    t2 = 0.25e0*lnx*lnx;
    l = *w/u;
    j = q/r;
    sum = j;
    t = cn = 1.0e0;
    n2 = 0.0e0;
    for(n=1; n<=30; n++) {
        bp2n = *b+n2;
        j = (bp2n*(bp2n+1.0e0)*j+(z+bp2n+1.0e0)*t)*v;
        n2 += 2.0e0;
        t *= t2;
        cn /= (n2*(n2+1.0e0));
        c[n-1] = cn;
        s = 0.0e0;
        if(n == 1) goto S40;
        nm1 = n-1;
        coef = *b-(double)n;
        for(i=1; i<=nm1; i++) {
            s += (coef*c[i-1]*d[n-i-1]);
            coef += *b;
        }
S40:
        d[n-1] = bm1*cn+s/(double)n;
        dj = d[n-1]*j;
        sum += dj;
        if(sum <= 0.0e0) goto S70;
        if(fabs(dj) <= *eps*(sum+l)) goto S60;
    }
S60:
/*
                    ADD THE RESULTS TO W
*/
    *ierr = 0;
    *w += (u*sum);
    return;
S70:
/*
               THE EXPANSION CANNOT BE COMPUTED
*/
    *ierr = 1;
    return;
}